

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O2

void __thiscall
cmComputeLinkInformation::GetRPath
          (cmComputeLinkInformation *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *runtimeDirs,bool for_install)

{
  string *config;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmMakefile *pcVar2;
  size_type sVar3;
  cmGeneratorTarget *pcVar4;
  pointer pbVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  byte bVar9;
  string *__lhs;
  char *pcVar10;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar11;
  string *c2;
  long lVar12;
  string *c2_00;
  LinkClosure *pLVar13;
  byte bVar14;
  pointer pbVar15;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar16;
  string install_rpath;
  string d;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  emitted;
  string suffix;
  string targetOutputDir;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pcVar2 = this->Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&emitted,"CMAKE_SKIP_RPATH",(allocator<char> *)&targetOutputDir);
  bVar6 = cmMakefile::IsOn(pcVar2,(string *)&emitted);
  sVar3 = (this->RuntimeFlag)._M_string_length;
  std::__cxx11::string::~string((string *)&emitted);
  bVar7 = true;
  if (!for_install) {
    pcVar4 = this->Target;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&emitted,"BUILD_WITH_INSTALL_RPATH",(allocator<char> *)&targetOutputDir);
    bVar7 = cmGeneratorTarget::GetPropertyAsBool(pcVar4,(string *)&emitted);
    std::__cxx11::string::~string((string *)&emitted);
  }
  if (bVar6 || sVar3 == 0) {
    bVar9 = 0;
LAB_002498fe:
    bVar14 = 0;
    bVar8 = false;
  }
  else {
    bVar6 = cmGeneratorTarget::HaveInstallTreeRPATH(this->Target,&this->Config);
    bVar8 = cmGeneratorTarget::HaveBuildTreeRPATH(this->Target,&this->Config);
    bVar9 = bVar8 & (bVar7 ^ 1U);
    if ((bVar7 ^ 1U) != 0) goto LAB_002498fe;
    pcVar2 = this->Makefile;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&emitted,"CMAKE_SKIP_INSTALL_RPATH",(allocator<char> *)&install_rpath);
    bVar8 = cmMakefile::IsOn(pcVar2,(string *)&emitted);
    if (bVar8) {
      bVar8 = false;
    }
    else {
      pcVar4 = this->Target;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&targetOutputDir,"INSTALL_RPATH_USE_LINK_PATH",(allocator<char> *)&d);
      bVar8 = cmGeneratorTarget::GetPropertyAsBool(pcVar4,&targetOutputDir);
      std::__cxx11::string::~string((string *)&targetOutputDir);
    }
    bVar14 = bVar7 & bVar6;
    std::__cxx11::string::~string((string *)&emitted);
  }
  pcVar2 = this->Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&emitted,"CMAKE_SHARED_LIBRARY_RPATH_ORIGIN_TOKEN",
             (allocator<char> *)&targetOutputDir);
  __lhs = cmMakefile::GetSafeDefinition(pcVar2,(string *)&emitted);
  std::__cxx11::string::~string((string *)&emitted);
  config = &this->Config;
  cmGeneratorTarget::GetDirectory(&targetOutputDir,this->Target,config,RuntimeBinaryArtifact);
  pcVar4 = this->Target;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&emitted,"BUILD_RPATH_USE_ORIGIN",(allocator<char> *)&install_rpath);
  bVar6 = cmGeneratorTarget::GetPropertyAsBool(pcVar4,(string *)&emitted);
  sVar3 = __lhs->_M_string_length;
  std::__cxx11::string::~string((string *)&emitted);
  emitted._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &emitted._M_t._M_impl.super__Rb_tree_header._M_header;
  emitted._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  emitted._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  emitted._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  paVar1 = &install_rpath.field_2;
  emitted._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       emitted._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if (bVar14 != 0) {
    install_rpath._M_string_length = 0;
    install_rpath.field_2._M_local_buf[0] = '\0';
    install_rpath._M_dataplus._M_p = (pointer)paVar1;
    cmGeneratorTarget::GetInstallRPATH(this->Target,config,&install_rpath);
    cmCLI_ExpandListUnique(install_rpath._M_dataplus._M_p,runtimeDirs,&emitted);
    std::__cxx11::string::~string((string *)&install_rpath);
  }
  if (bVar9 == 0) {
    if (bVar8 == false) goto LAB_00249fcb;
  }
  else {
    install_rpath._M_string_length = 0;
    install_rpath.field_2._M_local_buf[0] = '\0';
    install_rpath._M_dataplus._M_p = (pointer)paVar1;
    bVar7 = cmGeneratorTarget::GetBuildRPATH(this->Target,config,&install_rpath);
    if (bVar7) {
      cmCLI_ExpandListUnique(install_rpath._M_dataplus._M_p,runtimeDirs,&emitted);
    }
    std::__cxx11::string::~string((string *)&install_rpath);
  }
  install_rpath._M_string_length = 0;
  install_rpath.field_2._M_local_buf[0] = '\0';
  pcVar2 = this->Makefile;
  install_rpath._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&d,"CMAKE_SYSROOT_LINK",(allocator<char> *)&suffix);
  pcVar10 = cmMakefile::GetDefinition(pcVar2,&d);
  std::__cxx11::string::~string((string *)&d);
  if (pcVar10 == (char *)0x0) {
    pcVar2 = this->Makefile;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&d,"CMAKE_SYSROOT",(allocator<char> *)&suffix);
    cmMakefile::GetSafeDefinition(pcVar2,&d);
    std::__cxx11::string::_M_assign((string *)&install_rpath);
    std::__cxx11::string::~string((string *)&d);
  }
  else {
    std::__cxx11::string::assign((char *)&install_rpath);
  }
  pcVar2 = this->Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&d,"CMAKE_STAGING_PREFIX",(allocator<char> *)&suffix);
  pcVar10 = cmMakefile::GetDefinition(pcVar2,&d);
  std::__cxx11::string::~string((string *)&d);
  pcVar2 = this->Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&d,"CMAKE_INSTALL_PREFIX",(allocator<char> *)&suffix);
  cmMakefile::GetSafeDefinition(pcVar2,&d);
  std::__cxx11::string::~string((string *)&d);
  cmsys::SystemTools::ConvertToUnixSlashes(&install_rpath);
  pvVar11 = GetRuntimeSearchPath_abi_cxx11_(this);
  c2 = cmake::GetHomeOutputDirectory_abi_cxx11_(this->CMakeInstance);
  pbVar5 = (pvVar11->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar15 = (pvVar11->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start; pbVar15 != pbVar5;
      pbVar15 = pbVar15 + 1) {
    if (bVar9 == 0) {
      if (bVar8 != false) {
        c2_00 = cmake::GetHomeDirectory_abi_cxx11_(this->CMakeInstance);
        bVar7 = cmsys::SystemTools::ComparePath(pbVar15,c2_00);
        if (!bVar7) {
          bVar7 = cmsys::SystemTools::ComparePath(pbVar15,c2);
          if (bVar7) goto LAB_00249f57;
          bVar7 = cmsys::SystemTools::IsSubDirectory(pbVar15,c2_00);
          if (bVar7) goto LAB_00249f57;
          bVar7 = cmsys::SystemTools::IsSubDirectory(pbVar15,c2);
          if (bVar7) goto LAB_00249f57;
          std::__cxx11::string::string((string *)&d,(string *)pbVar15);
          if (install_rpath._M_string_length == 0) {
LAB_00249e17:
            if ((pcVar10 != (char *)0x0) && (*pcVar10 != '\0')) {
              lVar12 = std::__cxx11::string::find((char *)&d,(ulong)pcVar10);
              if (lVar12 == 0) {
                strlen(pcVar10);
                std::__cxx11::string::substr((ulong)&suffix,(ulong)&d);
                std::__cxx11::string::_M_assign((string *)&d);
                std::__cxx11::string::append((char *)&d);
                std::__cxx11::string::append((string *)&d);
                cmsys::SystemTools::ConvertToUnixSlashes(&d);
                goto LAB_00249f9b;
              }
            }
          }
          else {
            lVar12 = std::__cxx11::string::find((string *)&d,(ulong)&install_rpath);
            if (lVar12 != 0) goto LAB_00249e17;
            std::__cxx11::string::substr((ulong)&suffix,(ulong)&d);
            std::__cxx11::string::operator=((string *)&d,(string *)&suffix);
LAB_00249f9b:
            std::__cxx11::string::~string((string *)&suffix);
          }
          pVar16 = std::
                   _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                   ::_M_insert_unique<std::__cxx11::string_const&>
                             ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                               *)&emitted,&d);
          if (((undefined1  [16])pVar16 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       runtimeDirs,&d);
          }
          goto LAB_00249f4f;
        }
      }
    }
    else {
      std::__cxx11::string::string((string *)&d,(string *)pbVar15);
      if (install_rpath._M_string_length == 0) {
LAB_00249ca0:
        if ((pcVar10 != (char *)0x0) && (*pcVar10 != '\0')) {
          lVar12 = std::__cxx11::string::find((char *)&d,(ulong)pcVar10);
          if (lVar12 == 0) {
            strlen(pcVar10);
            std::__cxx11::string::substr((ulong)&suffix,(ulong)&d);
            std::__cxx11::string::_M_assign((string *)&d);
            std::__cxx11::string::append((char *)&d);
            std::__cxx11::string::append((string *)&d);
            cmsys::SystemTools::ConvertToUnixSlashes(&d);
            __return_storage_ptr__ = &suffix;
            goto LAB_00249f2b;
          }
        }
        if ((bVar6 && targetOutputDir._M_string_length != 0) && sVar3 != 0) {
          bVar7 = cmsys::SystemTools::ComparePath(&d,c2);
          if (!bVar7) {
            bVar7 = cmsys::SystemTools::IsSubDirectory(&d,c2);
            if (!bVar7) goto LAB_00249f30;
          }
          cmSystemTools::RelativePath(&suffix,&targetOutputDir,&d);
          std::__cxx11::string::operator=((string *)&d,(string *)&suffix);
          std::__cxx11::string::~string((string *)&suffix);
          if (d._M_string_length != 0) {
            __return_storage_ptr__ = &local_50;
            std::operator+(__return_storage_ptr__,__lhs,"/");
            std::operator+(&suffix,__return_storage_ptr__,&d);
            std::__cxx11::string::operator=((string *)&d,(string *)&suffix);
            std::__cxx11::string::~string((string *)&suffix);
            goto LAB_00249f2b;
          }
          std::__cxx11::string::_M_assign((string *)&d);
        }
      }
      else {
        lVar12 = std::__cxx11::string::find((string *)&d,(ulong)&install_rpath);
        if (lVar12 != 0) goto LAB_00249ca0;
        __return_storage_ptr__ = &suffix;
        std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)&d);
        std::__cxx11::string::operator=((string *)&d,(string *)__return_storage_ptr__);
LAB_00249f2b:
        std::__cxx11::string::~string((string *)__return_storage_ptr__);
      }
LAB_00249f30:
      pVar16 = std::
               _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
               ::_M_insert_unique<std::__cxx11::string_const&>
                         ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                           *)&emitted,&d);
      if (((undefined1  [16])pVar16 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)runtimeDirs,
                   &d);
      }
LAB_00249f4f:
      std::__cxx11::string::~string((string *)&d);
    }
LAB_00249f57:
  }
  std::__cxx11::string::~string((string *)&install_rpath);
LAB_00249fcb:
  pLVar13 = cmGeneratorTarget::GetLinkClosure(this->Target,config);
  pbVar5 = (pLVar13->Languages).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar15 = (pLVar13->Languages).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; pbVar15 != pbVar5; pbVar15 = pbVar15 + 1
      ) {
    std::operator+(&d,"CMAKE_",pbVar15);
    std::operator+(&install_rpath,&d,"_USE_IMPLICIT_LINK_DIRECTORIES_IN_RUNTIME_PATH");
    std::__cxx11::string::~string((string *)&d);
    bVar6 = cmMakefile::IsOn(this->Makefile,&install_rpath);
    if (bVar6) {
      std::operator+(&suffix,"CMAKE_",pbVar15);
      std::operator+(&d,&suffix,"_IMPLICIT_LINK_DIRECTORIES");
      std::__cxx11::string::~string((string *)&suffix);
      pcVar10 = cmMakefile::GetDefinition(this->Makefile,&d);
      if (pcVar10 != (char *)0x0) {
        cmCLI_ExpandListUnique(pcVar10,runtimeDirs,&emitted);
      }
      std::__cxx11::string::~string((string *)&d);
    }
    std::__cxx11::string::~string((string *)&install_rpath);
  }
  cmCLI_ExpandListUnique((this->RuntimeAlways)._M_dataplus._M_p,runtimeDirs,&emitted);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&emitted._M_t);
  std::__cxx11::string::~string((string *)&targetOutputDir);
  return;
}

Assistant:

void cmComputeLinkInformation::GetRPath(std::vector<std::string>& runtimeDirs,
                                        bool for_install) const
{
  // Select whether to generate runtime search directories.
  bool outputRuntime =
    !this->Makefile->IsOn("CMAKE_SKIP_RPATH") && !this->RuntimeFlag.empty();

  // Select whether to generate an rpath for the install tree or the
  // build tree.
  bool linking_for_install =
    (for_install ||
     this->Target->GetPropertyAsBool("BUILD_WITH_INSTALL_RPATH"));
  bool use_install_rpath =
    (outputRuntime && this->Target->HaveInstallTreeRPATH(this->Config) &&
     linking_for_install);
  bool use_build_rpath =
    (outputRuntime && this->Target->HaveBuildTreeRPATH(this->Config) &&
     !linking_for_install);
  bool use_link_rpath = outputRuntime && linking_for_install &&
    !this->Makefile->IsOn("CMAKE_SKIP_INSTALL_RPATH") &&
    this->Target->GetPropertyAsBool("INSTALL_RPATH_USE_LINK_PATH");

  // Select whether to use $ORIGIN in RPATHs for artifacts in the build tree.
  std::string const& originToken = this->Makefile->GetSafeDefinition(
    "CMAKE_SHARED_LIBRARY_RPATH_ORIGIN_TOKEN");
  std::string targetOutputDir = this->Target->GetDirectory(this->Config);
  bool use_relative_build_rpath =
    this->Target->GetPropertyAsBool("BUILD_RPATH_USE_ORIGIN") &&
    !originToken.empty() && !targetOutputDir.empty();

  // Construct the RPATH.
  std::set<std::string> emitted;
  if (use_install_rpath) {
    std::string install_rpath;
    this->Target->GetInstallRPATH(this->Config, install_rpath);
    cmCLI_ExpandListUnique(install_rpath.c_str(), runtimeDirs, emitted);
  }
  if (use_build_rpath) {
    // Add directories explicitly specified by user
    std::string build_rpath;
    if (this->Target->GetBuildRPATH(this->Config, build_rpath)) {
      // This will not resolve entries to use $ORIGIN, the user is expected to
      // do that if necessary.
      cmCLI_ExpandListUnique(build_rpath.c_str(), runtimeDirs, emitted);
    }
  }
  if (use_build_rpath || use_link_rpath) {
    std::string rootPath;
    if (const char* sysrootLink =
          this->Makefile->GetDefinition("CMAKE_SYSROOT_LINK")) {
      rootPath = sysrootLink;
    } else {
      rootPath = this->Makefile->GetSafeDefinition("CMAKE_SYSROOT");
    }
    const char* stagePath =
      this->Makefile->GetDefinition("CMAKE_STAGING_PREFIX");
    std::string const& installPrefix =
      this->Makefile->GetSafeDefinition("CMAKE_INSTALL_PREFIX");
    cmSystemTools::ConvertToUnixSlashes(rootPath);
    std::vector<std::string> const& rdirs = this->GetRuntimeSearchPath();
    std::string const& topBinaryDir =
      this->CMakeInstance->GetHomeOutputDirectory();
    for (std::string const& ri : rdirs) {
      // Put this directory in the rpath if using build-tree rpath
      // support or if using the link path as an rpath.
      if (use_build_rpath) {
        std::string d = ri;
        if (!rootPath.empty() && d.find(rootPath) == 0) {
          d = d.substr(rootPath.size());
        } else if (stagePath && *stagePath && d.find(stagePath) == 0) {
          std::string suffix = d.substr(strlen(stagePath));
          d = installPrefix;
          d += "/";
          d += suffix;
          cmSystemTools::ConvertToUnixSlashes(d);
        } else if (use_relative_build_rpath) {
          // If expansion of the $ORIGIN token is supported and permitted per
          // policy, use relative paths in the RPATH.
          if (cmSystemTools::ComparePath(d, topBinaryDir) ||
              cmSystemTools::IsSubDirectory(d, topBinaryDir)) {
            d = cmSystemTools::RelativePath(targetOutputDir, d);
            if (!d.empty()) {
              d = originToken + "/" + d;
            } else {
              d = originToken;
            }
          }
        }
        if (emitted.insert(d).second) {
          runtimeDirs.push_back(std::move(d));
        }
      } else if (use_link_rpath) {
        // Do not add any path inside the source or build tree.
        std::string const& topSourceDir =
          this->CMakeInstance->GetHomeDirectory();
        if (!cmSystemTools::ComparePath(ri, topSourceDir) &&
            !cmSystemTools::ComparePath(ri, topBinaryDir) &&
            !cmSystemTools::IsSubDirectory(ri, topSourceDir) &&
            !cmSystemTools::IsSubDirectory(ri, topBinaryDir)) {
          std::string d = ri;
          if (!rootPath.empty() && d.find(rootPath) == 0) {
            d = d.substr(rootPath.size());
          } else if (stagePath && *stagePath && d.find(stagePath) == 0) {
            std::string suffix = d.substr(strlen(stagePath));
            d = installPrefix;
            d += "/";
            d += suffix;
            cmSystemTools::ConvertToUnixSlashes(d);
          }
          if (emitted.insert(d).second) {
            runtimeDirs.push_back(std::move(d));
          }
        }
      }
    }
  }

  // Add runtime paths required by the languages to always be
  // present.  This is done even when skipping rpath support.
  {
    cmGeneratorTarget::LinkClosure const* lc =
      this->Target->GetLinkClosure(this->Config);
    for (std::string const& li : lc->Languages) {
      std::string useVar =
        "CMAKE_" + li + "_USE_IMPLICIT_LINK_DIRECTORIES_IN_RUNTIME_PATH";
      if (this->Makefile->IsOn(useVar)) {
        std::string dirVar = "CMAKE_" + li + "_IMPLICIT_LINK_DIRECTORIES";
        if (const char* dirs = this->Makefile->GetDefinition(dirVar)) {
          cmCLI_ExpandListUnique(dirs, runtimeDirs, emitted);
        }
      }
    }
  }

  // Add runtime paths required by the platform to always be
  // present.  This is done even when skipping rpath support.
  cmCLI_ExpandListUnique(this->RuntimeAlways.c_str(), runtimeDirs, emitted);
}